

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.cpp
# Opt level: O0

string * __thiscall slang::syntax::SyntaxNode::toString_abi_cxx11_(SyntaxNode *this)

{
  SyntaxPrinter *in_RDI;
  SyntaxPrinter *in_stack_ffffffffffffff78;
  SyntaxNode *node;
  SyntaxPrinter *this_00;
  
  node = (SyntaxNode *)0x0;
  this_00 = (SyntaxPrinter *)0x0;
  SyntaxPrinter::SyntaxPrinter(in_RDI);
  SyntaxPrinter::print(this_00,node);
  SyntaxPrinter::str_abi_cxx11_(in_stack_ffffffffffffff78);
  SyntaxPrinter::~SyntaxPrinter((SyntaxPrinter *)0x39b7fd);
  return &in_RDI->buffer;
}

Assistant:

std::string SyntaxNode::toString() const {
    return SyntaxPrinter().print(*this).str();
}